

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O3

void Acb_VerilogSimpleWrite(Acb_Ntk_t *p,char *pFileName)

{
  byte bVar1;
  char cVar2;
  uint uVar3;
  int iVar4;
  int *piVar5;
  int iVar6;
  FILE *__stream;
  char *pcVar7;
  ulong uVar8;
  char *pcVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  
  __stream = fopen(pFileName,"wb");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open file \"%s\" for writing.\n",pFileName);
    return;
  }
  pcVar7 = Abc_NamStr(p->pDesign->pStrs,p->NameId);
  fprintf(__stream,"\nmodule %s (\n  ",pcVar7);
  uVar10 = (p->vCis).nSize;
  uVar8 = (ulong)uVar10;
  if (p->nRegs < (int)uVar10) {
    lVar12 = 0;
    do {
      if ((int)uVar8 <= lVar12) goto LAB_0039464b;
      uVar10 = (p->vCis).pArray[lVar12];
      if ((long)(int)uVar10 < 1) goto LAB_00394689;
      uVar3 = (p->vObjName).nSize;
      if ((int)uVar3 < 1) goto LAB_0039466a;
      if (uVar3 <= uVar10) goto LAB_0039464b;
      pcVar7 = Abc_NamStr(p->pDesign->pStrs,(p->vObjName).pArray[(int)uVar10]);
      fprintf(__stream,"%s, ",pcVar7);
      lVar12 = lVar12 + 1;
      uVar8 = (ulong)(p->vCis).nSize;
    } while (lVar12 < (long)(uVar8 - (long)p->nRegs));
  }
  fwrite("\n  ",3,1,__stream);
  uVar10 = (p->vCos).nSize;
  uVar8 = (ulong)uVar10;
  if (p->nRegs < (int)uVar10) {
    lVar12 = 0;
    pcVar7 = "T = %d\t\t";
    do {
      if ((int)uVar8 <= lVar12) goto LAB_0039464b;
      uVar10 = (p->vCos).pArray[lVar12];
      if ((long)(int)uVar10 < 1) goto LAB_00394689;
      uVar3 = (p->vObjName).nSize;
      if ((int)uVar3 < 1) goto LAB_0039466a;
      if (uVar3 <= uVar10) goto LAB_0039464b;
      pcVar9 = Abc_NamStr(p->pDesign->pStrs,(p->vObjName).pArray[(int)uVar10]);
      fprintf(__stream,"%s%s",pcVar7 + 8,pcVar9);
      lVar12 = lVar12 + 1;
      uVar8 = (ulong)(p->vCos).nSize;
      pcVar7 = "    \"%s\", ";
    } while (lVar12 < (long)(uVar8 - (long)p->nRegs));
  }
  fwrite("\n);\n\n",5,1,__stream);
  uVar10 = (p->vCis).nSize;
  uVar8 = (ulong)uVar10;
  if (p->nRegs < (int)uVar10) {
    lVar12 = 0;
    do {
      if ((int)uVar8 <= lVar12) goto LAB_0039464b;
      uVar10 = (p->vCis).pArray[lVar12];
      if ((long)(int)uVar10 < 1) goto LAB_00394689;
      uVar3 = (p->vObjName).nSize;
      if ((int)uVar3 < 1) goto LAB_0039466a;
      if (uVar3 <= uVar10) goto LAB_0039464b;
      pcVar7 = Abc_NamStr(p->pDesign->pStrs,(p->vObjName).pArray[(int)uVar10]);
      fprintf(__stream,"  input %s;\n",pcVar7);
      lVar12 = lVar12 + 1;
      uVar8 = (ulong)(p->vCis).nSize;
    } while (lVar12 < (long)(uVar8 - (long)p->nRegs));
  }
  fputc(10,__stream);
  uVar10 = (p->vCos).nSize;
  uVar8 = (ulong)uVar10;
  if (p->nRegs < (int)uVar10) {
    lVar12 = 0;
    do {
      if ((int)uVar8 <= lVar12) goto LAB_0039464b;
      uVar10 = (p->vCos).pArray[lVar12];
      if ((long)(int)uVar10 < 1) {
LAB_00394689:
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acb.h"
                      ,0x10e,"char *Acb_ObjNameStr(Acb_Ntk_t *, int)");
      }
      uVar3 = (p->vObjName).nSize;
      if ((int)uVar3 < 1) goto LAB_0039466a;
      if (uVar3 <= uVar10) goto LAB_0039464b;
      pcVar7 = Abc_NamStr(p->pDesign->pStrs,(p->vObjName).pArray[(int)uVar10]);
      fprintf(__stream,"  output %s;\n",pcVar7);
      lVar12 = lVar12 + 1;
      uVar8 = (ulong)(p->vCos).nSize;
    } while (lVar12 < (long)(uVar8 - (long)p->nRegs));
  }
  fputc(10,__stream);
  iVar6 = (p->vObjType).nSize;
  if (1 < iVar6) {
    uVar8 = 1;
    do {
      lVar12 = (long)iVar6;
      if (lVar12 <= (long)uVar8) goto LAB_003946a8;
      uVar10 = (uint)(byte)(p->vObjType).pArray[uVar8];
      if ((4 < uVar10) || ((0x19U >> (uVar10 & 0x1f) & 1) == 0)) {
        if ((long)(p->vObjFans).nSize <= (long)uVar8) goto LAB_0039464b;
        iVar4 = (p->vObjFans).pArray[uVar8];
        if (((long)iVar4 < 0) || ((p->vFanSto).nSize <= iVar4)) goto LAB_003946c7;
        if (0 < (p->vFanSto).pArray[iVar4]) {
          uVar13 = (ulong)(p->vObjName).nSize;
          if ((long)uVar13 < 1) goto LAB_0039466a;
          if (uVar13 <= uVar8) goto LAB_0039464b;
          pcVar7 = Abc_NamStr(p->pDesign->pStrs,(p->vObjName).pArray[uVar8]);
          fprintf(__stream,"  wire %s;\n",pcVar7);
          iVar6 = (p->vObjType).nSize;
          lVar12 = (long)iVar6;
        }
      }
      uVar8 = uVar8 + 1;
    } while ((long)uVar8 < lVar12);
  }
  fputc(10,__stream);
  uVar10 = (p->vObjType).nSize;
  uVar8 = (ulong)uVar10;
  if (1 < (int)uVar10) {
    uVar13 = 1;
    do {
      if ((long)(int)uVar8 <= (long)uVar13) {
LAB_003946a8:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                      ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
      }
      bVar1 = (p->vObjType).pArray[uVar13];
      if ((4 < bVar1) || ((0x19U >> (bVar1 & 0x1f) & 1) == 0)) {
        if ((long)(p->vObjFans).nSize <= (long)uVar13) {
LAB_0039464b:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar6 = (p->vObjFans).pArray[uVar13];
        if (((long)iVar6 < 0) || ((p->vFanSto).nSize <= iVar6)) {
LAB_003946c7:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
        }
        if ((p->vFanSto).pArray[iVar6] < 1) {
          if (1 < bVar1 - 7) {
            __assert_fail("Acb_ObjType(p, iObj) == ABC_OPER_CONST_F || Acb_ObjType(p, iObj) == ABC_OPER_CONST_T"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbFunc.c"
                          ,0x1cc,"void Acb_VerilogSimpleWrite(Acb_Ntk_t *, char *)");
          }
          fprintf(__stream,"  %s (","buf");
          if ((long)(p->vObjType).nSize <= (long)uVar13) goto LAB_003946a8;
          cVar2 = (p->vObjType).pArray[uVar13];
          if (cVar2 == '\t') {
            fwrite(" 1\'bx",5,1,__stream);
          }
          else {
            fprintf(__stream," 1\'b%d",(ulong)(cVar2 == '\b'));
          }
          fwrite(" );\n",4,1,__stream);
        }
        else {
          lVar12 = ftell(__stream);
          if ((long)(p->vObjType).nSize <= (long)uVar13) goto LAB_003946a8;
          cVar2 = (p->vObjType).pArray[uVar13];
          pcVar7 = "const0";
          switch(cVar2) {
          case '\a':
            break;
          case '\b':
            pcVar7 = "const1";
            break;
          case '\t':
            pcVar7 = "constX";
            break;
          case '\n':
          case '\x13':
          case '\x14':
switchD_00394348_caseD_a:
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbFunc.c"
                          ,0x6d,"char *Acb_Oper2Name(int)");
          case '\v':
            pcVar7 = "buf";
            break;
          case '\f':
            pcVar7 = "not";
            break;
          case '\r':
            pcVar7 = "and";
            break;
          case '\x0e':
            pcVar7 = "nand";
            break;
          case '\x0f':
            pcVar7 = "or";
            break;
          case '\x10':
            pcVar7 = "nor";
            break;
          case '\x11':
            pcVar7 = "xor";
            break;
          case '\x12':
            pcVar7 = "xnor";
            break;
          case '\x15':
            pcVar7 = "mux";
            break;
          default:
            if (cVar2 != 'N') goto switchD_00394348_caseD_a;
            pcVar7 = "_DC";
          }
          fprintf(__stream,"  %s (",pcVar7);
          uVar8 = (ulong)(p->vObjName).nSize;
          if ((long)uVar8 < 1) {
LAB_0039466a:
            __assert_fail("Acb_NtkHasObjNames(p)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acb.h"
                          ,0x10d,"int Acb_ObjName(Acb_Ntk_t *, int)");
          }
          if (uVar8 <= uVar13) goto LAB_0039464b;
          pcVar7 = Abc_NamStr(p->pDesign->pStrs,(p->vObjName).pArray[uVar13]);
          fprintf(__stream," %s",pcVar7);
          if ((long)(p->vObjFans).nSize <= (long)uVar13) goto LAB_0039464b;
          iVar6 = (p->vObjFans).pArray[uVar13];
          lVar14 = (long)iVar6;
          if ((lVar14 < 0) || ((p->vFanSto).nSize <= iVar6)) goto LAB_003946c7;
          piVar5 = (p->vFanSto).pArray;
          if (0 < piVar5[lVar14]) {
            lVar11 = 0;
            do {
              uVar10 = piVar5[lVar14 + lVar11 + 1];
              if ((long)(int)uVar10 < 1) goto LAB_00394689;
              uVar3 = (p->vObjName).nSize;
              if ((int)uVar3 < 1) goto LAB_0039466a;
              if (uVar3 <= uVar10) goto LAB_0039464b;
              lVar11 = lVar11 + 1;
              pcVar7 = Abc_NamStr(p->pDesign->pStrs,(p->vObjName).pArray[(int)uVar10]);
              fprintf(__stream,", %s",pcVar7);
            } while (lVar11 < piVar5[lVar14]);
          }
          fwrite(" );",3,1,__stream);
          uVar8 = (ulong)(p->vObjWeight).nSize;
          if (0 < (long)uVar8) {
            if (uVar8 <= uVar13) goto LAB_0039464b;
            if (0 < (p->vObjWeight).pArray[uVar13]) {
              lVar14 = ftell(__stream);
              uVar8 = (ulong)(p->vObjWeight).nSize;
              if ((long)uVar8 < 1) {
                __assert_fail("Acb_NtkHasObjWeights(p)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acb.h"
                              ,0x10a,"int Acb_ObjWeight(Acb_Ntk_t *, int)");
              }
              if (uVar8 <= uVar13) goto LAB_0039464b;
              fprintf(__stream," %*s // weight = %d",(ulong)(((int)lVar12 - (int)lVar14) + 0x37),"",
                      (ulong)(uint)(p->vObjWeight).pArray[uVar13]);
            }
          }
          fputc(10,__stream);
        }
      }
      uVar13 = uVar13 + 1;
      uVar8 = (ulong)(p->vObjType).nSize;
    } while ((long)uVar13 < (long)uVar8);
  }
  fwrite("\nendmodule\n\n",0xc,1,__stream);
  fclose(__stream);
  return;
}

Assistant:

void Acb_VerilogSimpleWrite( Acb_Ntk_t * p, char * pFileName )
{
    int i, iObj, fFirst = 1;
    FILE * pFile = fopen( pFileName, "wb" ); 
    if ( pFile == NULL ) { printf( "Cannot open file \"%s\" for writing.\n", pFileName ); return; }

    fprintf( pFile, "\nmodule %s (\n  ", Acb_NtkName(p) );

    Acb_NtkForEachPi( p, iObj, i )
        fprintf( pFile, "%s, ", Acb_ObjNameStr(p, iObj) );
    fprintf( pFile, "\n  " );

    Acb_NtkForEachPo( p, iObj, i )
        fprintf( pFile, "%s%s", fFirst ? "":", ", Acb_ObjNameStr(p, iObj) ), fFirst = 0;
    fprintf( pFile, "\n);\n\n" );

    Acb_NtkForEachPi( p, iObj, i )
        fprintf( pFile, "  input %s;\n", Acb_ObjNameStr(p, iObj) );
    fprintf( pFile, "\n" );

    Acb_NtkForEachPo( p, iObj, i )
        fprintf( pFile, "  output %s;\n", Acb_ObjNameStr(p, iObj) );
    fprintf( pFile, "\n" );

    Acb_NtkForEachNode( p, iObj )
        if ( Acb_ObjFaninNum(p, iObj) > 0 )
            fprintf( pFile, "  wire %s;\n", Acb_ObjNameStr(p, iObj) );
    fprintf( pFile, "\n" );

    Acb_NtkForEachNode( p, iObj )
        if ( Acb_ObjFaninNum(p, iObj) > 0 )
        {
            int * pFanin, iFanin, k, start = ftell(pFile)+55;
            fprintf( pFile, "  %s (", Acb_Oper2Name( Acb_ObjType(p, iObj) ) );
            fprintf( pFile, " %s", Acb_ObjNameStr(p, iObj) );
            Acb_ObjForEachFaninFast( p, iObj, pFanin, iFanin, k )
                //if ( iFanin == 0 ) fprintf( pFile, ", <zero>" ); else
                fprintf( pFile, ", %s", Acb_ObjNameStr(p, iFanin) );
            fprintf( pFile, " );" );
            if ( Acb_NtkHasObjWeights(p) && Acb_ObjWeight(p, iObj) > 0 )
                fprintf( pFile, " %*s // weight = %d", (int)(start-ftell(pFile)), "", Acb_ObjWeight(p, iObj) );
            fprintf( pFile, "\n" );
        }
        else // constant nodes
        {
            assert( Acb_ObjType(p, iObj) == ABC_OPER_CONST_F || Acb_ObjType(p, iObj) == ABC_OPER_CONST_T );
            fprintf( pFile, "  %s (", Acb_Oper2Name( ABC_OPER_BIT_BUF ) );
            if ( Acb_ObjType(p, iObj) == ABC_OPER_CONST_X )
                fprintf( pFile, " 1\'bx" );
            else
                fprintf( pFile, " 1\'b%d", Acb_ObjType(p, iObj) == ABC_OPER_CONST_T );
            fprintf( pFile, " );\n" );
        }

    fprintf( pFile, "\nendmodule\n\n" );
    fclose( pFile );
}